

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

void __thiscall wasm::Thread::Thread(Thread *this,ThreadPool *parent)

{
  bool bVar1;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> local_30 [3];
  ThreadPool *local_18;
  ThreadPool *parent_local;
  Thread *this_local;
  
  this->parent = parent;
  local_18 = parent;
  parent_local = (ThreadPool *)this;
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,std::default_delete<std::thread>> *)&this->thread);
  std::mutex::mutex(&this->mutex);
  std::condition_variable::condition_variable(&this->condition);
  this->done = false;
  std::function<wasm::ThreadWorkState_()>::function(&this->doWork,(nullptr_t)0x0);
  bVar1 = ThreadPool::isRunning(local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!parent->isRunning()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/threads.cpp"
                  ,0x33,"wasm::Thread::Thread(ThreadPool *)");
  }
  std::make_unique<std::thread,void(&)(void*),wasm::Thread*>
            ((_func_void_void_ptr *)local_30,(Thread **)mainLoop);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=(&this->thread,local_30)
  ;
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(local_30);
  return;
}

Assistant:

Thread::Thread(ThreadPool* parent) : parent(parent) {
  assert(!parent->isRunning());
  thread = std::make_unique<std::thread>(mainLoop, this);
}